

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Mio_LibGateSimulate(Mio_Gate_t *pGate,word **ppFaninSims,int nWords,word *pObjSim)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  void *__ptr;
  ulong uVar7;
  ulong uVar8;
  word wVar9;
  word uFanins [6];
  word awStack_68 [7];
  
  uVar4 = Mio_GateReadPinNum(pGate);
  pVVar5 = Mio_GateReadExpr(pGate);
  if (6 < (int)uVar4) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                  ,0x216,"void Mio_LibGateSimulate(Mio_Gate_t *, word **, int, word *)");
  }
  if (0 < nWords) {
    uVar1 = pVVar5->nSize;
    iVar3 = uVar4 * 2;
    uVar8 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar6 = 0;
        do {
          awStack_68[uVar6] = ppFaninSims[uVar6][uVar8];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      __ptr = calloc((long)((int)uVar1 / 2),8);
      if (1 < (int)uVar1) {
        uVar6 = 0;
        do {
          if ((ulong)uVar1 + 1 >> 1 == uVar6) goto LAB_002b18d9;
          uVar2 = pVVar5->pArray[uVar6 * 2];
          if (uVar2 == 0xffffffff) {
            uVar7 = 0;
          }
          else if (uVar2 == 0xfffffffe) {
            uVar7 = 0xffffffffffffffff;
          }
          else if ((int)uVar2 < iVar3) {
            if ((uVar2 & 1) == 0) {
              uVar7 = awStack_68[(int)uVar2 >> 1];
            }
            else {
              uVar7 = awStack_68[(int)uVar2 / 2];
LAB_002b178d:
              uVar7 = ~uVar7;
            }
          }
          else {
            if ((uVar2 & 1) != 0) {
              uVar7 = *(ulong *)((long)__ptr + (long)(int)((int)uVar2 / 2 - uVar4) * 8);
              goto LAB_002b178d;
            }
            uVar7 = *(ulong *)((long)__ptr + (long)(int)(((int)uVar2 >> 1) - uVar4) * 8);
          }
          if (uVar1 >> 1 == uVar6) {
LAB_002b18d9:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar2 = pVVar5->pArray[uVar6 * 2 + 1];
          if (uVar2 == 0xffffffff) {
            wVar9 = 0;
          }
          else if (uVar2 == 0xfffffffe) {
            wVar9 = 0xffffffffffffffff;
          }
          else if ((int)uVar2 < iVar3) {
            if ((uVar2 & 1) == 0) {
              wVar9 = awStack_68[(int)uVar2 >> 1];
            }
            else {
              wVar9 = awStack_68[(int)uVar2 / 2];
LAB_002b1805:
              wVar9 = ~wVar9;
            }
          }
          else {
            if ((uVar2 & 1) != 0) {
              wVar9 = *(ulong *)((long)__ptr + (long)(int)((int)uVar2 / 2 - uVar4) * 8);
              goto LAB_002b1805;
            }
            wVar9 = *(ulong *)((long)__ptr + (long)(int)(((int)uVar2 >> 1) - uVar4) * 8);
          }
          *(word *)((long)__ptr + uVar6 * 8) = wVar9 & uVar7;
          uVar6 = uVar6 + 1;
        } while ((uint)((int)uVar1 / 2) != uVar6);
      }
      if ((int)uVar1 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      uVar2 = pVVar5->pArray[(ulong)uVar1 - 1];
      if (uVar2 == 0xffffffff) {
        wVar9 = 0;
      }
      else if (uVar2 == 0xfffffffe) {
        wVar9 = 0xffffffffffffffff;
      }
      else if ((int)uVar2 < iVar3) {
        if ((uVar2 & 1) == 0) {
          wVar9 = awStack_68[(int)uVar2 >> 1];
        }
        else {
          uVar6 = awStack_68[(int)uVar2 / 2];
LAB_002b1894:
          wVar9 = ~uVar6;
        }
      }
      else {
        if ((uVar2 & 1) != 0) {
          uVar6 = *(ulong *)((long)__ptr + (long)(int)((int)uVar2 / 2 - uVar4) * 8);
          goto LAB_002b1894;
        }
        wVar9 = *(word *)((long)__ptr + (long)(int)(((int)uVar2 >> 1) - uVar4) * 8);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      pObjSim[uVar8] = wVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nWords);
  }
  return;
}

Assistant:

void Mio_LibGateSimulate( Mio_Gate_t * pGate, word * ppFaninSims[6], int nWords, word * pObjSim )
{
    int i, w, nVars = Mio_GateReadPinNum(pGate);
    Vec_Int_t * vExpr = Mio_GateReadExpr( pGate );
    assert( nVars <= 6 );
    for ( w = 0; w < nWords; w++ )
    {
        word uFanins[6];
        for ( i = 0; i < nVars; i++ )
            uFanins[i] = ppFaninSims[i][w];
        pObjSim[w] = Exp_Truth6( nVars, vExpr, uFanins );
    }
}